

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmtable.cpp
# Opt level: O1

void __thiscall icu_63::Formattable::Formattable(Formattable *this,int32_t value)

{
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__Formattable_0047a860;
  (this->fBogus).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_0048be70;
  (this->fBogus).fUnion.fStackFields.fLengthAndFlags = 2;
  (this->fValue).fObject = (UObject *)0x0;
  this->fType = kLong;
  this->fDecimalStr = (CharString *)0x0;
  this->fDecimalQuantity = (DecimalQuantity *)0x0;
  icu_63::UnicodeString::setToBogus(&this->fBogus);
  *(long *)&this->fValue = (long)value;
  return;
}

Assistant:

Formattable::Formattable(int32_t value)
{
    init();
    fValue.fInt64 = value;
}